

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

char * ossl_strerror(unsigned_long error,char *buf,size_t size)

{
  size_t sVar1;
  char *__src;
  ulong uVar2;
  
  *buf = '\0';
  sVar1 = ossl_version(buf,size);
  uVar2 = (size - 2) - sVar1;
  if (sVar1 <= size - 2 && uVar2 != 0) {
    (buf + sVar1)[0] = ':';
    (buf + sVar1)[1] = ' ';
    buf[sVar1 + 2] = '\0';
    buf = buf + sVar1 + 2;
    size = uVar2;
  }
  ERR_error_string_n(error,buf,size);
  if ((*buf == '\0') && ((ulong)(error != 0) * 5 + 8 < size)) {
    __src = "Unknown error";
    if (error == 0) {
      __src = "No error";
    }
    strcpy(buf,__src);
  }
  return buf;
}

Assistant:

static char *ossl_strerror(unsigned long error, char *buf, size_t size)
{
  size_t len;
  DEBUGASSERT(size);
  *buf = '\0';

  len = ossl_version(buf, size);
  DEBUGASSERT(len < (size - 2));
  if(len < (size - 2)) {
    buf += len;
    size -= (len + 2);
    *buf++ = ':';
    *buf++ = ' ';
    *buf = '\0';
  }

#if defined(OPENSSL_IS_BORINGSSL) || defined(OPENSSL_IS_AWSLC)
  ERR_error_string_n((uint32_t)error, buf, size);
#else
  ERR_error_string_n(error, buf, size);
#endif

  if(!*buf) {
    const char *msg = error ? "Unknown error" : "No error";
    if(strlen(msg) < size)
      strcpy(buf, msg);
  }

  return buf;
}